

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

void __thiscall cppcms::crypto::key::set_hex(key *this,char *ptr,size_t len)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  invalid_argument *piVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  string local_40;
  
  if (this->data_ != (char *)0x0) {
    memset(this->data_,0,this->size_);
    if (this->data_ != (char *)0x0) {
      operator_delete__(this->data_);
    }
    this->data_ = (char *)0x0;
    this->size_ = 0;
  }
  if (len != 0) {
    if ((len & 1) != 0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x30);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "cppcms::crypto::key: the hexadecimal key length is not multiple of 2","");
      booster::invalid_argument::invalid_argument(piVar4,&local_40);
      __cxa_throw(piVar4,&booster::invalid_argument::typeinfo,
                  booster::invalid_argument::~invalid_argument);
    }
    uVar2 = 1;
    uVar7 = 0;
    do {
      if ((9 < (byte)(ptr[uVar7] - 0x30U)) &&
         ((uVar6 = (byte)ptr[uVar7] - 0x41, 0x25 < uVar6 ||
          ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x30);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "cppcms::crypto::key: the hexadecimal key has invalid characters","");
        booster::invalid_argument::invalid_argument(piVar4,&local_40);
        __cxa_throw(piVar4,&booster::invalid_argument::typeinfo,
                    booster::invalid_argument::~invalid_argument);
      }
      uVar7 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar7 < len);
    this->size_ = len >> 1;
    pcVar3 = (char *)operator_new__(len >> 1);
    this->data_ = pcVar3;
    lVar5 = 0;
    lVar8 = 0;
    do {
      cVar1 = ptr[lVar8];
      bVar9 = cVar1 - 0x30;
      if (9 < bVar9) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar9 = cVar1 + 0xa9;
        }
        else {
          bVar9 = cVar1 - 0x37;
          if (5 < (byte)(cVar1 + 0xbfU)) {
            bVar9 = 0;
          }
        }
      }
      cVar1 = ptr[lVar8 + 1];
      bVar10 = cVar1 - 0x30;
      if (9 < bVar10) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar10 = cVar1 + 0xa9;
        }
        else {
          bVar10 = cVar1 - 0x37;
          if (5 < (byte)(cVar1 + 0xbfU)) {
            bVar10 = 0;
          }
        }
      }
      this->data_[lVar5] = bVar9 << 4 | bVar10;
      lVar8 = lVar8 + 2;
      lVar5 = lVar5 + 1;
    } while ((uint)lVar8 < (uint)len);
  }
  return;
}

Assistant:

void key::set_hex(char const *ptr,size_t len)
	{
		reset();
		if(len == 0)
			return;
		if(len % 2 != 0) {
			throw booster::invalid_argument("cppcms::crypto::key: the hexadecimal key length is not multiple of 2");
		}
		for(unsigned i=0;i<len;i++) {
			char c=ptr[i];
			if(	('0'<=c && c<='9')
				|| ('a' <= c && c<='f')
				|| ('A' <= c && c<='F')
			  )
			{
				continue;
			}
			throw booster::invalid_argument("cppcms::crypto::key: the hexadecimal key has invalid characters");
		}
		size_ = len / 2;
		data_ = new char[size_];
		for(unsigned h=0,b=0;h<len;h+=2,b++) {
			data_[b] = (from_hex(ptr[h]) << 4) + from_hex(ptr[h+1]);
		}
	}